

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv__io_stop(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv__queue *puVar1;
  uint *puVar2;
  uint uVar3;
  uv__queue *puVar4;
  
  if ((events & 0xffffdff8) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                  ,0x394,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events != 0) {
    uVar3 = w->fd;
    if (uVar3 != 0xffffffff) {
      if ((int)uVar3 < 0) {
        __assert_fail("w->fd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                      ,0x39a,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
      }
      if (uVar3 < loop->nwatchers) {
        puVar1 = &w->watcher_queue;
        puVar2 = &w->pevents;
        *puVar2 = *puVar2 & ~events;
        puVar4 = (w->watcher_queue).next;
        if (*puVar2 == 0) {
          ((w->watcher_queue).prev)->next = puVar4;
          ((w->watcher_queue).next)->prev = (w->watcher_queue).prev;
          (w->watcher_queue).next = puVar1;
          (w->watcher_queue).prev = puVar1;
          w->events = 0;
          if (loop->watchers[w->fd] == w) {
            if (loop->nfds == 0) {
              __assert_fail("loop->nfds > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                            ,0x3a8,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
            }
            loop->watchers[w->fd] = (uv__io_t *)0x0;
            loop->nfds = loop->nfds - 1;
          }
        }
        else if (puVar4 == puVar1) {
          (w->watcher_queue).next = &loop->watcher_queue;
          puVar4 = (loop->watcher_queue).prev;
          (w->watcher_queue).prev = puVar4;
          puVar4->next = puVar1;
          (loop->watcher_queue).prev = puVar1;
        }
      }
    }
    return;
  }
  __assert_fail("0 != events",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                ,0x395,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

void uv__io_stop(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI)));
  assert(0 != events);

  if (w->fd == -1)
    return;

  assert(w->fd >= 0);

  /* Happens when uv__io_stop() is called on a handle that was never started. */
  if ((unsigned) w->fd >= loop->nwatchers)
    return;

  w->pevents &= ~events;

  if (w->pevents == 0) {
    uv__queue_remove(&w->watcher_queue);
    uv__queue_init(&w->watcher_queue);
    w->events = 0;

    if (w == loop->watchers[w->fd]) {
      assert(loop->nfds > 0);
      loop->watchers[w->fd] = NULL;
      loop->nfds--;
    }
  }
  else if (uv__queue_empty(&w->watcher_queue))
    uv__queue_insert_tail(&loop->watcher_queue, &w->watcher_queue);
}